

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O1

void __thiscall
Diligent::HashCombiner<Diligent::DefaultHasher,_Diligent::TextureViewDesc>::operator()
          (HashCombiner<Diligent::DefaultHasher,_Diligent::TextureViewDesc> *this,
          TextureViewDesc *TexViewDesc)

{
  ushort uVar1;
  TextureComponentMapping local_c;
  uint local_8;
  uint local_4;
  
  local_4._0_1_ = TexViewDesc->ViewType;
  local_4._1_1_ = TexViewDesc->TextureDim;
  local_4._2_2_ = TexViewDesc->Format;
  uVar1._0_1_ = TexViewDesc->AccessFlags;
  uVar1._1_1_ = TexViewDesc->Flags;
  local_8 = (uint)uVar1;
  local_c = TexViewDesc->Swizzle;
  HashCombine<unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int,unsigned_int>
            (&((this->super_HashCombinerBase<Diligent::DefaultHasher>).m_Hasher)->m_Seed,&local_4,
             &TexViewDesc->MostDetailedMip,&TexViewDesc->NumMipLevels,
             &(TexViewDesc->field_5).FirstArraySlice,&(TexViewDesc->field_6).NumArraySlices,&local_8
             ,(uint *)&local_c);
  return;
}

Assistant:

void operator()(const TextureViewDesc& TexViewDesc) const
    {
        ASSERT_SIZEOF(TexViewDesc.ViewType, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.TextureDim, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.Format, 2, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.AccessFlags, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.Flags, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(TexViewDesc.Swizzle, 4, "Hash logic below may be incorrect.");

        // Ignore Name. This is consistent with the operator==
        this->m_Hasher(
            ((static_cast<uint32_t>(TexViewDesc.ViewType) << 0u) |
             (static_cast<uint32_t>(TexViewDesc.TextureDim) << 8u) |
             (static_cast<uint32_t>(TexViewDesc.Format) << 16u)),
            TexViewDesc.MostDetailedMip,
            TexViewDesc.NumMipLevels,
            TexViewDesc.FirstArraySlice,
            TexViewDesc.NumArraySlices,
            ((static_cast<uint32_t>(TexViewDesc.AccessFlags) << 0u) |
             (static_cast<uint32_t>(TexViewDesc.Flags) << 8u)),
            TexViewDesc.Swizzle.AsUint32());
        ASSERT_SIZEOF64(TexViewDesc, 40, "Did you add new members to TextureViewDesc? Please handle them here.");
    }